

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall
SubprocessTestBadCommandStderr::~SubprocessTestBadCommandStderr
          (SubprocessTestBadCommandStderr *this)

{
  SubprocessTestBadCommandStderr *this_local;
  
  anon_unknown.dwarf_add81::SubprocessTest::~SubprocessTest(&this->super_SubprocessTest);
  return;
}

Assistant:

TEST_F(SubprocessTest, BadCommandStderr) {
  Subprocess* subproc = subprocs_.Add("cmd /c ninja_no_such_command");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    // Pretend we discovered that stderr was ready for writing.
    subprocs_.DoWork();
  }

  EXPECT_EQ(ExitFailure, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());
}